

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 local_2e0 [8];
  Interpreter interpreter;
  ifstream ifs;
  allocator local_69;
  string local_68 [48];
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  if ((argc == 0) || (argc == 1)) {
    printf("Type filename:\n");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_38);
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::ifstream::ifstream(&interpreter.s,local_38,8);
  Interpreter::Interpreter((Interpreter *)local_2e0,(ifstream *)&interpreter.s);
  Interpreter::load((Interpreter *)local_2e0);
  Interpreter::run((Interpreter *)local_2e0);
  Interpreter::~Interpreter((Interpreter *)local_2e0);
  std::ifstream::~ifstream(&interpreter.s);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string filename;
    if (argc == 0 || argc == 1) {
        printf("Type filename:\n");
        getline(std::cin, filename);
    } else {
        filename = std::string(argv[1]);
    }

    std::ifstream ifs(filename);
    Interpreter interpreter(ifs);

    interpreter.load();

#ifdef MEASURE_TIME
#ifdef MEASURE_TIME_MILLIS
    long time = getCurrentTime();
#else
    clock_t time = clock();
#endif
    for (int i = 0; i < MEASURE_COUNT; i++) {
        interpreter.setOpPos(0);
#endif

        interpreter.run();

#ifdef MEASURE_TIME
    }
#ifdef MEASURE_TIME_MILLIS
    time = getCurrentTime() - time;
#else
    time = clock() - time;
#endif
    printf("completed %i iterations in %li\n", MEASURE_COUNT, time);
#endif

    return 0;
}